

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O0

int Abc_SuppGenFindBest(Vec_Wrd_t *p,int nBits,int *pMerit)

{
  int local_128 [2];
  int Counts [64];
  int kBest;
  int k;
  int *pMerit_local;
  int nBits_local;
  Vec_Wrd_t *p_local;
  
  Counts[0x3e] = 0;
  memset(local_128,0,0x100);
  Abc_SuppGenProfile(p,nBits,local_128);
  for (Counts[0x3f] = 1; Counts[0x3f] < nBits; Counts[0x3f] = Counts[0x3f] + 1) {
    if (local_128[Counts[0x3e]] < local_128[Counts[0x3f]]) {
      Counts[0x3e] = Counts[0x3f];
    }
  }
  *pMerit = local_128[Counts[0x3e]];
  return Counts[0x3e];
}

Assistant:

int Abc_SuppGenFindBest( Vec_Wrd_t * p, int nBits, int * pMerit )
{
    int k, kBest = 0, Counts[64] = {0};
    Abc_SuppGenProfile( p, nBits, Counts );
    for ( k = 1; k < nBits; k++ )
        if ( Counts[kBest] < Counts[k] )
            kBest = k;
    *pMerit = Counts[kBest];
    return kBest;
}